

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

array_container_t * array_container_create_given_capacity(int32_t size)

{
  array_container_t *paVar1;
  uint16_t *puVar2;
  
  paVar1 = (array_container_t *)(*global_memory_hook.malloc)(0x10);
  if (paVar1 == (array_container_t *)0x0) {
LAB_00107df0:
    paVar1 = (array_container_t *)0x0;
  }
  else {
    if (size < 1) {
      paVar1->array = (uint16_t *)0x0;
    }
    else {
      puVar2 = (uint16_t *)(*global_memory_hook.malloc)((long)size * 2);
      paVar1->array = puVar2;
      if (puVar2 == (uint16_t *)0x0) {
        (*global_memory_hook.free)(paVar1);
        goto LAB_00107df0;
      }
    }
    paVar1->capacity = size;
    paVar1->cardinality = 0;
  }
  return paVar1;
}

Assistant:

array_container_t *array_container_create_given_capacity(int32_t size) {
    array_container_t *container;

    if ((container = (array_container_t *)roaring_malloc(
             sizeof(array_container_t))) == NULL) {
        return NULL;
    }

    if (size <= 0) {  // we don't want to rely on malloc(0)
        container->array = NULL;
    } else if ((container->array = (uint16_t *)roaring_malloc(sizeof(uint16_t) *
                                                              size)) == NULL) {
        roaring_free(container);
        return NULL;
    }

    container->capacity = size;
    container->cardinality = 0;

    return container;
}